

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_clear(Tree *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  (this->m_arena).len = 0;
  this->m_arena_pos = 0;
  this->m_free_tail = 0;
  (this->m_arena).str = (char *)0x0;
  this->m_size = 0;
  this->m_free_head = 0;
  this->m_buf = (NodeData *)0x0;
  this->m_cap = 0;
  for (lVar2 = 0x60; lVar2 != 0x100; lVar2 = lVar2 + 0x28) {
    puVar1 = (undefined8 *)((long)(this->m_tag_directives + -2) + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->m_tag_directives + lVar2 + -0x60);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->m_tag_directives + lVar2 + -0x40) = 0;
  }
  return;
}

Assistant:

void Tree::_clear()
{
    m_buf = nullptr;
    m_cap = 0;
    m_size = 0;
    m_free_head = 0;
    m_free_tail = 0;
    m_arena = {};
    m_arena_pos = 0;
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = {};
}